

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O3

int lejp_parser_pop(lejp_ctx *ctx)

{
  byte bVar1;
  int iVar2;
  
  if (ctx->pst_sp == '\0') {
    iVar2 = -1;
  }
  else {
    bVar1 = ctx->pst_sp - 1;
    ctx->pst_sp = bVar1;
    iVar2 = 0;
    _lws_log(0x10,"%s: popped parser stack to %d\n","lejp_parser_pop",(ulong)bVar1);
    ctx->path_match = '\0';
    lejp_check_path_match(ctx);
  }
  return iVar2;
}

Assistant:

int
lejp_parser_pop(struct lejp_ctx *ctx)
{
	if (!ctx->pst_sp)
		return -1;

	ctx->pst_sp--;
	lwsl_debug("%s: popped parser stack to %d\n", __func__, ctx->pst_sp);

	ctx->path_match = 0; /* force it to check */
	lejp_check_path_match(ctx);

	return 0;
}